

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_sam(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  DisasJumpType DVar1;
  int iVar2;
  TCGv_i64 arg2;
  ulong uVar3;
  uintptr_t o_1;
  
  iVar2 = (int)s->insn->data;
  uVar3 = 0xffffff;
  if (iVar2 != 0) {
    uVar3 = -(ulong)(iVar2 != 1) | 0x7fffffff;
  }
  if (uVar3 < (s->base).pc_next) {
    gen_program_exception(s,6);
    DVar1 = DISAS_NORETURN;
  }
  else {
    tcg_ctx = s->uc->tcg_ctx;
    s->pc_tmp = s->pc_tmp & uVar3;
    arg2 = tcg_const_i64_s390x(tcg_ctx,(long)iVar2);
    tcg_gen_deposit_i64_s390x(tcg_ctx,tcg_ctx->psw_mask,tcg_ctx->psw_mask,arg2,0x1f,2);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    DVar1 = DISAS_TARGET_3;
  }
  return DVar1;
}

Assistant:

static DisasJumpType op_sam(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int sam = s->insn->data;
    TCGv_i64 tsam;
    uint64_t mask;

    switch (sam) {
    case 0:
        mask = 0xffffff;
        break;
    case 1:
        mask = 0x7fffffff;
        break;
    default:
        mask = -1;
        break;
    }

    /* Bizarre but true, we check the address of the current insn for the
       specification exception, not the next to be executed.  Thus the PoO
       documents that Bad Things Happen two bytes before the end.  */
    if (s->base.pc_next & ~mask) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }
    s->pc_tmp &= mask;

    tsam = tcg_const_i64(tcg_ctx, sam);
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->psw_mask, tcg_ctx->psw_mask, tsam, 31, 2);
    tcg_temp_free_i64(tcg_ctx, tsam);

    /* Always exit the TB, since we (may have) changed execution mode.  */
    return DISAS_PC_STALE;
}